

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_scalar_split(secp256k1_scalar *full)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  secp256k1_scalar *psVar6;
  secp256k1_scalar *message;
  uint uVar7;
  int extraout_EDX;
  secp256k1_scalar *count;
  secp256k1_scalar *seckey;
  uint uVar8;
  ulong uVar9;
  secp256k1_ge *pubkey;
  secp256k1_ge *ge;
  secp256k1_scalar *psVar10;
  secp256k1_context *psVar11;
  secp256k1_context *psVar12;
  byte bVar13;
  secp256k1_scalar *psVar14;
  secp256k1_ge *r;
  secp256k1_ge *output;
  secp256k1_ge *output_00;
  uint uVar15;
  secp256k1_scalar slam;
  secp256k1_scalar s1;
  uchar tmp [32];
  uchar zero [32];
  secp256k1_scalar s;
  secp256k1_scalar sStack_328;
  secp256k1_ge *psStack_300;
  secp256k1_ge *psStack_2f8;
  secp256k1_context *psStack_2f0;
  secp256k1_ge *psStack_2e8;
  secp256k1_ge *psStack_2e0;
  secp256k1_scalar sStack_2d8;
  ulong uStack_2b0;
  secp256k1_scalar *psStack_2a8;
  bool bStack_299;
  undefined8 uStack_298;
  undefined1 auStack_290 [65];
  uchar auStack_24f [7];
  secp256k1_ge *psStack_248;
  long lStack_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  size_t sStack_200;
  int iStack_1f8;
  uint uStack_1f4;
  secp256k1_scalar *psStack_1f0;
  ulong uStack_1e8;
  undefined1 auStack_1e0 [89];
  uint64_t uStack_187;
  uint64_t uStack_17f;
  uint64_t uStack_177;
  uint64_t uStack_16f;
  uint64_t uStack_167;
  secp256k1_ge sStack_150;
  secp256k1_scalar *psStack_f8;
  secp256k1_scalar *psStack_f0;
  secp256k1_scalar local_c8;
  secp256k1_scalar local_a8;
  secp256k1_scalar local_88;
  char local_68 [40];
  secp256k1_scalar local_40;
  secp256k1_ge *psVar16;
  
  local_68[0x10] = '\0';
  local_68[0x11] = '\0';
  local_68[0x12] = '\0';
  local_68[0x13] = '\0';
  local_68[0x14] = '\0';
  local_68[0x15] = '\0';
  local_68[0x16] = '\0';
  local_68[0x17] = '\0';
  local_68[0x18] = '\0';
  local_68[0x19] = '\0';
  local_68[0x1a] = '\0';
  local_68[0x1b] = '\0';
  local_68[0x1c] = '\0';
  local_68[0x1d] = '\0';
  local_68[0x1e] = '\0';
  local_68[0x1f] = '\0';
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\0';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = '\0';
  secp256k1_scalar_split_lambda(&local_a8,&local_c8,full);
  psVar14 = &local_40;
  secp256k1_scalar_mul(psVar14,&secp256k1_const_lambda,&local_c8);
  psVar6 = psVar14;
  psVar10 = psVar14;
  secp256k1_scalar_add(psVar14,psVar14,&local_a8);
  iVar4 = (int)psVar6;
  if ((((local_40.d[0] == full->d[0]) && (local_40.d[1] == full->d[1])) &&
      (local_40.d[2] == full->d[2])) && (local_40.d[3] == full->d[3])) {
    uVar15 = -(int)((long)local_a8.d[3] >> 0x3f);
    uVar7 = uVar15 ^ 1;
    uVar8 = uVar7;
    if (local_a8.d[2] == 0xffffffffffffffff) {
      uVar8 = 0;
    }
    if (0x5d576e7357a4501c < local_a8.d[1]) {
      uVar7 = 0;
    }
    uVar7 = (uVar7 | uVar8 | local_a8.d[3] < 0x7fffffffffffffff) ^ 1;
    psVar14 = (secp256k1_scalar *)0xdfe92f46681b20a0;
    uVar8 = 0;
    if (0xdfe92f46681b20a0 < local_a8.d[0]) {
      uVar8 = uVar7;
    }
    if (0x5d576e7357a4501d < local_a8.d[1]) {
      uVar8 = uVar7;
    }
    if (uVar8 != 0 || uVar15 != 0) {
      secp256k1_scalar_negate(&local_a8,&local_a8);
    }
    uVar15 = (uint)(local_c8.d[3] >> 0x3f);
    uVar7 = uVar15 ^ 1;
    uVar8 = uVar7;
    if (local_c8.d[2] == 0xffffffffffffffff) {
      uVar8 = 0;
    }
    if (0x5d576e7357a4501c < local_c8.d[1]) {
      uVar7 = 0;
    }
    uVar7 = (uVar7 | uVar8 | local_c8.d[3] < 0x7fffffffffffffff) ^ 1;
    uVar8 = 0;
    if (0xdfe92f46681b20a0 < local_c8.d[0]) {
      uVar8 = uVar7;
    }
    if (0x5d576e7357a4501d < local_c8.d[1]) {
      uVar8 = uVar7;
    }
    uVar8 = uVar8 | uVar15;
    full = (secp256k1_scalar *)(ulong)uVar8;
    if (uVar8 != 0) {
      secp256k1_scalar_negate(&local_c8,&local_c8);
    }
    psVar10 = &local_88;
    psVar6 = &local_a8;
    secp256k1_scalar_get_b32((uchar *)psVar10,psVar6);
    iVar4 = (int)psVar6;
    lVar5 = 0;
    do {
      if (local_68[lVar5] != *(char *)((long)local_88.d + lVar5)) goto LAB_0016c1b1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
    psVar10 = &local_88;
    iVar4 = (int)&local_c8;
    secp256k1_scalar_get_b32((uchar *)psVar10,&local_c8);
    lVar5 = 0;
    while (local_68[lVar5] == *(char *)((long)local_88.d + lVar5)) {
      lVar5 = lVar5 + 1;
      if (lVar5 == 0x10) {
        return;
      }
    }
  }
  else {
    test_scalar_split_cold_3();
LAB_0016c1b1:
    test_scalar_split_cold_1();
  }
  test_scalar_split_cold_2();
  psStack_f0 = psVar14;
  psStack_f8 = full;
  iStack_1f8 = extraout_EDX;
  auStack_290._60_4_ = iVar4;
  sStack_200 = 3;
  psStack_1f0 = psVar10;
  do {
    uStack_16f = psVar10[1].d[2];
    uStack_167 = psVar10[1].d[3];
    uStack_17f = psVar10[1].d[0];
    uStack_177 = psVar10[1].d[1];
    auStack_1e0._81_8_ = psVar10->d[2];
    uStack_187 = psVar10->d[3];
    auStack_1e0._65_8_ = psVar10->d[0];
    auStack_1e0._73_8_ = psVar10->d[1];
    stack0xfffffffffffffdb0 = (_func_void_char_ptr_void_ptr *)0x4d430001;
    psStack_248 = (secp256k1_ge *)(auStack_1e0 + sStack_200 + 0x40);
    lVar5 = sStack_200 - 0x41;
    lStack_240 = -lVar5;
    uStack_238 = 0;
    uStack_230 = 0;
    uStack_228 = 0;
    auStack_290._0_8_ = 0;
    bStack_299 = auStack_290._60_4_ != 0 && sStack_200 == 0x21;
    uStack_1f4 = (uint)(lVar5 == 0) * 4;
    uStack_1e8 = (ulong)(lVar5 == 0 || sStack_200 == 0x21);
    uVar9 = 0;
    do {
      output = (secp256k1_ge *)(auStack_290 + 0x40);
      pubkey = (secp256k1_ge *)0x0;
      auStack_1e0[0x40] = (char)uVar9;
      uVar8 = (uint)uVar9;
      uVar15 = *(byte *)((long)psVar10[1].d + 0x1f) & 1 | 2;
      psVar16 = (secp256k1_ge *)(ulong)uVar15;
      if ((auStack_290._60_4_ == 0 || iStack_1f8 == 0) || (uVar8 & 4) != uStack_1f4) {
        r = (secp256k1_ge *)0x0;
      }
      else {
        r = (secp256k1_ge *)
            CONCAT71((int7)((ulong)psVar14 >> 8),
                     ((uVar8 & 0xfb) == uVar15 || uVar8 == 4) & (byte)uStack_1e8);
      }
      bVar13 = (byte)r;
      psVar11 = CTX;
      if (((bStack_299 != false && (uVar8 & 0xfe) == 2) | bVar13) != 1) {
        auStack_1e0._48_8_ = 0xfefefefefefefefe;
        auStack_1e0._56_8_ = 0xfefefefefefefefe;
        auStack_1e0._32_8_ = 0xfefefefefefefefe;
        auStack_1e0._40_8_ = 0xfefefefefefefefe;
        auStack_1e0._16_8_ = 0xfefefefefefefefe;
        auStack_1e0._24_8_ = 0xfefefefefefefefe;
        auStack_1e0._0_8_ = 0xfefefefefefefefe;
        auStack_1e0._8_8_ = 0xfefefefefefefefe;
        stack0xfffffffffffffdb0 = (_func_void_char_ptr_void_ptr *)0x4d430001;
        r = (secp256k1_ge *)auStack_1e0;
        lStack_240 = 0x40;
        uStack_238 = 0;
        uStack_230 = 0;
        uStack_228 = 0;
        auStack_290._0_8_ = 0;
        psStack_2a8 = (secp256k1_scalar *)0x16c7c0;
        ge = r;
        psStack_248 = r;
        iVar4 = secp256k1_ec_pubkey_parse(CTX,(secp256k1_pubkey *)r,auStack_1e0 + 0x40,sStack_200);
        psVar12 = CTX;
        if (iVar4 != 0) {
          psStack_2a8 = (secp256k1_scalar *)0x16c8e1;
          ec_pubkey_parse_pointtest_cold_1();
          goto LAB_0016c8e1;
        }
        lStack_240 = 0x40;
        uStack_238 = 0;
        uStack_230 = 0;
        uStack_228 = 0;
        auStack_290._0_8_ = 0;
        unique0x10000a57 = (CTX->illegal_callback).fn;
        psStack_248 = (secp256k1_ge *)(CTX->illegal_callback).data;
        if (secp256k1_context_static == CTX) {
          psStack_2a8 = (secp256k1_scalar *)0x16c8b4;
          (*(CTX->illegal_callback).fn)
                    ("ctx != secp256k1_context_static",(CTX->illegal_callback).data);
          psVar11 = CTX;
        }
        else {
          (CTX->illegal_callback).fn = counting_callback_fn;
          (psVar12->illegal_callback).data = auStack_290;
          psVar11 = psVar12;
        }
        ge = &sStack_150;
        psStack_2a8 = (secp256k1_scalar *)0x16c861;
        iVar4 = secp256k1_pubkey_load(psVar11,ge,(secp256k1_pubkey *)r);
        psVar12 = CTX;
        if (iVar4 != 0) goto LAB_0016c8eb;
        (CTX->illegal_callback).fn = stack0xfffffffffffffdb0;
        (psVar12->illegal_callback).data = psStack_248;
        if (auStack_290._0_4_ == 1) goto LAB_0016c890;
LAB_0016c8f0:
        psStack_2a8 = (secp256k1_scalar *)0x16c8f5;
        ec_pubkey_parse_pointtest_cold_3();
        psVar14 = psVar10;
LAB_0016c8f5:
        psVar10 = psVar14;
        psStack_2a8 = (secp256k1_scalar *)0x16c8fa;
        ec_pubkey_parse_pointtest_cold_4();
LAB_0016c8fa:
        psStack_2a8 = (secp256k1_scalar *)0x16c8ff;
        ec_pubkey_parse_pointtest_cold_12();
LAB_0016c8ff:
        psStack_2a8 = (secp256k1_scalar *)0x16c904;
        ec_pubkey_parse_pointtest_cold_6();
        output_00 = psVar16;
LAB_0016c904:
        psStack_2a8 = (secp256k1_scalar *)0x16c909;
        ec_pubkey_parse_pointtest_cold_11();
LAB_0016c909:
        psStack_2a8 = (secp256k1_scalar *)0x16c90e;
        ec_pubkey_parse_pointtest_cold_10();
LAB_0016c90e:
        psStack_2a8 = (secp256k1_scalar *)0x16c913;
        ec_pubkey_parse_pointtest_cold_7();
        psVar16 = output_00;
LAB_0016c913:
        psStack_2a8 = (secp256k1_scalar *)0x16c918;
        ec_pubkey_parse_pointtest_cold_8();
        output_00 = output;
LAB_0016c918:
        psStack_2a8 = (secp256k1_scalar *)0x16c91d;
        ec_pubkey_parse_pointtest_cold_5();
LAB_0016c91d:
        psStack_2a8 = (secp256k1_scalar *)test_sort_helper;
        ec_pubkey_parse_pointtest_cold_9();
        psStack_2a8 = psVar10;
        uStack_2b0 = uVar9;
        psVar10 = &sStack_2d8;
        if (count == (secp256k1_scalar *)0x0) {
          psStack_2e0 = (secp256k1_ge *)0x16c9b2;
          secp256k1_hsort(&sStack_2d8,0,8,secp256k1_ec_pubkey_sort_cmp,CTX);
        }
        else {
          psVar14 = (secp256k1_scalar *)0x0;
          do {
            sStack_2d8.d[(long)psVar14] =
                 (uint64_t)
                 ((&(psVar11->ecmult_gen_ctx).scalar_offset)[(ge->x).n[(long)psVar14] * 2 + -1].d +
                 3);
            psVar14 = (secp256k1_scalar *)((long)psVar14->d + 1);
          } while (count != psVar14);
          psStack_2e0 = (secp256k1_ge *)0x16c96b;
          psVar14 = count;
          psVar12 = CTX;
          secp256k1_hsort(&sStack_2d8,(size_t)count,8,secp256k1_ec_pubkey_sort_cmp,CTX);
          psVar6 = (secp256k1_scalar *)0x0;
          do {
            message = (secp256k1_scalar *)sStack_2d8.d[(long)psVar6];
            lVar5 = 0;
            do {
              cVar1 = *(char *)((long)message->d + lVar5);
              psVar14 = (secp256k1_scalar *)CONCAT71((int7)((ulong)psVar14 >> 8),cVar1);
              if (cVar1 != *(char *)((long)(psVar11->ecmult_gen_ctx).scalar_offset.d + lVar5 + -8))
              {
                psStack_2e0 = (secp256k1_ge *)random_sign;
                test_sort_helper_cold_1();
                psStack_300 = r;
                psStack_2f8 = output_00;
                psStack_2f0 = psVar11;
                psStack_2e8 = psVar16;
                psStack_2e0 = pubkey;
                do {
                  testutil_random_scalar_order_test(&sStack_328);
                  iVar4 = secp256k1_ecdsa_sig_sign
                                    (&CTX->ecmult_gen_ctx,psVar10,psVar14,seckey,message,&sStack_328
                                     ,(int *)psVar12);
                } while (iVar4 == 0);
                return;
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 != 0x40);
            psVar6 = (secp256k1_scalar *)((long)psVar6->d + 1);
            psVar11 = (secp256k1_context *)((psVar11->ecmult_gen_ctx).ge_offset.x.n + 3);
          } while (psVar6 != count);
        }
        return;
      }
      auStack_1e0._0_8_ = 0;
      auStack_1e0._8_8_ = 0;
      auStack_1e0._16_8_ = 0;
      auStack_1e0._24_8_ = 0;
      auStack_1e0._32_8_ = 0;
      auStack_1e0._40_8_ = 0;
      auStack_1e0._48_8_ = 0;
      auStack_1e0._56_8_ = 0;
      stack0xfffffffffffffdb0 = (_func_void_char_ptr_void_ptr *)0x4d430001;
      psVar14 = (secp256k1_scalar *)0x0;
      pubkey = (secp256k1_ge *)auStack_1e0;
      lStack_240 = 0x40;
      uStack_238 = 0;
      uStack_230 = 0;
      uStack_228 = 0;
      auStack_290._0_8_ = 0;
      psStack_2a8 = (secp256k1_scalar *)0x16c3c7;
      ge = pubkey;
      psStack_248 = pubkey;
      iVar4 = secp256k1_ec_pubkey_parse
                        (CTX,(secp256k1_pubkey *)pubkey,auStack_1e0 + 0x40,sStack_200);
      psVar10 = psVar14;
      if (iVar4 == 0) {
LAB_0016c8e1:
        psStack_2a8 = (secp256k1_scalar *)0x16c8e6;
        ec_pubkey_parse_pointtest_cold_14();
        psVar14 = psVar10;
LAB_0016c8e6:
        psStack_2a8 = (secp256k1_scalar *)0x16c8eb;
        ec_pubkey_parse_pointtest_cold_13();
        psVar10 = psVar14;
LAB_0016c8eb:
        psStack_2a8 = (secp256k1_scalar *)0x16c8f0;
        ec_pubkey_parse_pointtest_cold_2();
        goto LAB_0016c8f0;
      }
      stack0xfffffffffffffdb0 = (_func_void_char_ptr_void_ptr *)0x4d430005;
      lStack_240 = 0x40;
      uStack_238 = 0;
      uStack_230 = 0;
      uStack_228 = 0;
      auStack_290._48_8_ = 0x41;
      auStack_290._0_8_ = 0x4d430001;
      auStack_290._16_8_ = 0x41;
      auStack_290._24_8_ = 0;
      auStack_290._32_8_ = 0;
      auStack_290._40_8_ = 0;
      uStack_298 = 0;
      psStack_2a8 = (secp256k1_scalar *)0x16c484;
      ge = output;
      psVar11 = CTX;
      auStack_290._8_8_ = output;
      psStack_248 = pubkey;
      iVar4 = secp256k1_ec_pubkey_serialize
                        (CTX,(uchar *)output,(size_t *)(auStack_290 + 0x30),
                         (secp256k1_pubkey *)pubkey,0x102);
      psVar10 = psStack_1f0;
      if (iVar4 == 0) goto LAB_0016c8e6;
      auStack_290._0_8_ = 0x4d430005;
      auStack_290._8_8_ = output;
      auStack_290._16_8_ = auStack_290._48_8_;
      auStack_290._24_8_ = 0;
      auStack_290._32_8_ = 0;
      auStack_290._40_8_ = 0;
      uVar2 = (ulong)((long)psVar11 << 3) >> 0x33;
      uVar3 = (((long)psVar11 << 3 | (ulong)psVar11 >> 0x3d) << 0xd | uVar2) >> 3;
      psVar11 = (secp256k1_context *)(uVar3 << 0x33 | (uVar2 << 0x3d | uVar3) >> 0xd);
      uStack_298 = 0;
      pubkey = (secp256k1_ge *)0x0;
      if (auStack_290._48_8_ != 0x21) goto LAB_0016c8f5;
      lVar5 = 1;
      do {
        output_00 = output;
        if (auStack_290[lVar5 + 0x40] != auStack_1e0[lVar5 + 0x40]) goto LAB_0016c918;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x21);
      if ((sStack_200 == 0x21) && (auStack_290[0x40] != auStack_1e0[0x40])) goto LAB_0016c8fa;
      r = (secp256k1_ge *)auStack_1e0;
      if (bVar13 != 0) {
        if (auStack_290[0x40] != (char)uVar15) goto LAB_0016c8ff;
        psStack_2a8 = (secp256k1_scalar *)0x16c562;
        ge = &sStack_150;
        psVar11 = CTX;
        iVar4 = secp256k1_pubkey_load(CTX,&sStack_150,(secp256k1_pubkey *)r);
        output_00 = &sStack_150;
        if (iVar4 == 0) goto LAB_0016c904;
        auStack_1e0._48_8_ = 0;
        auStack_1e0._56_8_ = 0;
        auStack_1e0._32_8_ = 0;
        auStack_1e0._40_8_ = 0;
        auStack_1e0._16_8_ = 0;
        auStack_1e0._24_8_ = 0;
        auStack_1e0._0_8_ = 0;
        auStack_1e0._8_8_ = 0;
        auStack_290._0_8_ = 0x4d430001;
        auStack_290._16_8_ = 0x40;
        auStack_290._24_8_ = 0;
        auStack_290._32_8_ = 0;
        auStack_290._40_8_ = 0;
        output = (secp256k1_ge *)auStack_290;
        uStack_298 = 0;
        psStack_2a8 = (secp256k1_scalar *)0x16c5e7;
        auStack_290._8_8_ = r;
        secp256k1_ge_to_storage((secp256k1_ge_storage *)r,&sStack_150);
        auStack_290._48_8_ = 0x41;
        auStack_290._0_8_ = 0x4d430001;
        output_00 = (secp256k1_ge *)(auStack_290 + 0x40);
        auStack_290._16_8_ = 0x41;
        auStack_290._24_8_ = 0;
        auStack_290._32_8_ = 0;
        auStack_290._40_8_ = 0;
        uStack_298 = 0;
        psStack_2a8 = (secp256k1_scalar *)0x16c6a1;
        ge = output_00;
        psVar11 = CTX;
        auStack_290._8_8_ = output_00;
        iVar4 = secp256k1_ec_pubkey_serialize
                          (CTX,(uchar *)output_00,(size_t *)(auStack_290 + 0x30),
                           (secp256k1_pubkey *)r,2);
        if (iVar4 == 0) goto LAB_0016c909;
        auStack_290._0_8_ = 0x4d430005;
        auStack_290._8_8_ = output_00;
        auStack_290._16_8_ = auStack_290._48_8_;
        auStack_290._24_8_ = 0;
        auStack_290._32_8_ = 0;
        auStack_290._40_8_ = 0;
        uVar2 = (ulong)((long)psVar11 << 3) >> 0x33;
        uVar3 = (((long)psVar11 << 3 | (ulong)psVar11 >> 0x3d) << 0xd | uVar2) >> 3;
        psVar11 = (secp256k1_context *)(uVar3 << 0x33 | (uVar2 << 0x3d | uVar3) >> 0xd);
        uStack_298 = 0;
        if (auStack_290._48_8_ == 0x41) {
          psVar16 = output_00;
          if (auStack_290[0x40] != '\x04') goto LAB_0016c913;
          lVar5 = 0;
          do {
            if (auStack_24f[lVar5] != *(uchar *)((long)psVar10->d + lVar5)) goto LAB_0016c91d;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x40);
          goto LAB_0016c890;
        }
        goto LAB_0016c90e;
      }
LAB_0016c890:
      psVar14 = (secp256k1_scalar *)auStack_1e0;
      uVar9 = (ulong)(uVar8 + 1);
    } while (uVar8 + 1 != 0x100);
    sStack_200 = sStack_200 + 1;
    if (sStack_200 == 0x42) {
      return;
    }
  } while( true );
}

Assistant:

static void test_scalar_split(const secp256k1_scalar* full) {
    secp256k1_scalar s, s1, slam;
    const unsigned char zero[32] = {0};
    unsigned char tmp[32];

    secp256k1_scalar_split_lambda(&s1, &slam, full);

    /* check slam*lambda + s1 == full */
    secp256k1_scalar_mul(&s, &secp256k1_const_lambda, &slam);
    secp256k1_scalar_add(&s, &s, &s1);
    CHECK(secp256k1_scalar_eq(&s, full));

    /* check that both are <= 128 bits in size */
    if (secp256k1_scalar_is_high(&s1)) {
        secp256k1_scalar_negate(&s1, &s1);
    }
    if (secp256k1_scalar_is_high(&slam)) {
        secp256k1_scalar_negate(&slam, &slam);
    }

    secp256k1_scalar_get_b32(tmp, &s1);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
    secp256k1_scalar_get_b32(tmp, &slam);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
}